

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeometryUtil.cpp
# Opt level: O2

void btGeometryUtil::getPlaneEquationsFromVertices
               (btAlignedObjectArray<btVector3> *vertices,
               btAlignedObjectArray<btVector3> *planeEquationsOut)

{
  uint uVar1;
  int iVar2;
  btVector3 *v1;
  btVector3 *v2;
  bool bVar3;
  uint uVar4;
  btScalar bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  btVector3 bVar9;
  uint local_bc;
  uint local_b8;
  long local_a8;
  btVector3 local_a0;
  ulong local_90;
  ulong local_88;
  long local_80;
  btVector3 *local_78;
  ulong local_70;
  undefined1 local_68 [16];
  btVector3 local_50;
  btVector3 local_40;
  
  uVar1 = vertices->m_size;
  local_88 = 0;
  local_90 = 0;
  if (0 < (int)uVar1) {
    local_90 = (ulong)uVar1;
  }
  local_a8 = 1;
  local_bc = 2;
  for (; local_88 != local_90; local_88 = local_88 + 1) {
    v2 = vertices->m_data + local_88;
    local_b8 = local_bc;
    for (local_80 = local_a8; (int)local_80 < (int)uVar1; local_80 = local_80 + 1) {
      local_78 = vertices->m_data + local_80;
      for (local_70 = (ulong)local_b8; (int)local_70 < (int)uVar1; local_70 = local_70 + 1) {
        v1 = vertices->m_data + local_70;
        local_40 = operator-(local_78,v2);
        local_50 = operator-(v1,v2);
        iVar2 = 2;
        uVar4 = 0x3f800000;
        while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
          local_68 = ZEXT416(uVar4);
          bVar9 = btVector3::cross(&local_40,&local_50);
          local_a0.m_floats[1] = (float)local_68._0_4_ * bVar9.m_floats[1];
          local_a0.m_floats[0] = (float)local_68._0_4_ * bVar9.m_floats[0];
          local_a0.m_floats[2] = bVar9.m_floats[2] * (float)local_68._0_4_;
          local_a0.m_floats[3] = 0.0;
          bVar5 = btVector3::length2(&local_a0);
          if (0.0001 < bVar5) {
            btVector3::normalize(&local_a0);
            bVar3 = notExist(&local_a0,planeEquationsOut);
            if (bVar3) {
              fVar7 = local_a0.m_floats[1] * v2->m_floats[1];
              fVar6 = local_a0.m_floats[0] * v2->m_floats[0];
              fVar8 = local_a0.m_floats[2] * v2->m_floats[2];
              local_a0.m_floats[3] = -(fVar8 + fVar6 + fVar7);
              bVar3 = areVerticesBehindPlane(&local_a0,vertices,0.01);
              if (bVar3) {
                btAlignedObjectArray<btVector3>::push_back(planeEquationsOut,&local_a0);
              }
            }
          }
          uVar4 = 0xbf800000;
        }
      }
      local_b8 = local_b8 + 1;
    }
    local_bc = local_bc + 1;
    local_a8 = local_a8 + 1;
  }
  return;
}

Assistant:

void	btGeometryUtil::getPlaneEquationsFromVertices(btAlignedObjectArray<btVector3>& vertices, btAlignedObjectArray<btVector3>& planeEquationsOut )
{
		const int numvertices = vertices.size();
	// brute force:
	for (int i=0;i<numvertices;i++)
	{
		const btVector3& N1 = vertices[i];
		

		for (int j=i+1;j<numvertices;j++)
		{
			const btVector3& N2 = vertices[j];
				
			for (int k=j+1;k<numvertices;k++)
			{

				const btVector3& N3 = vertices[k];

				btVector3 planeEquation,edge0,edge1;
				edge0 = N2-N1;
				edge1 = N3-N1;
				btScalar normalSign = btScalar(1.);
				for (int ww=0;ww<2;ww++)
				{
					planeEquation = normalSign * edge0.cross(edge1);
					if (planeEquation.length2() > btScalar(0.0001))
					{
						planeEquation.normalize();
						if (notExist(planeEquation,planeEquationsOut))
						{
							planeEquation[3] = -planeEquation.dot(N1);
							
								//check if inside, and replace supportingVertexOut if needed
								if (areVerticesBehindPlane(planeEquation,vertices,btScalar(0.01)))
								{
									planeEquationsOut.push_back(planeEquation);
								}
						}
					}
					normalSign = btScalar(-1.);
				}
			
			}
		}
	}

}